

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall
pobr::main::App::App
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  Mat *segments;
  initializer_list<unsigned_char> list;
  initializer_list<unsigned_char> list_00;
  Matx<unsigned_char,_3,_1> local_1b3;
  undefined4 local_1b0;
  uchar local_1ab [3];
  ImgProcessor imgProcessor;
  string filepath;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  letterSegments;
  CmdParser cmdParser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  Mat img;
  undefined1 local_78 [16];
  Size local_68;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0,arguments);
  utils::CmdParser::CmdParser(&cmdParser,&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  std::__cxx11::string::string((string *)&imgProcessor,"file",(allocator *)&img);
  utils::CmdParser::getFlagValue(&filepath,&cmdParser,(string *)&imgProcessor);
  std::__cxx11::string::~string((string *)&imgProcessor);
  std::__cxx11::string::string((string *)&imgProcessor,"binary",(allocator *)&img);
  bVar1 = utils::CmdParser::hasFlag(&cmdParser,(string *)&imgProcessor);
  std::__cxx11::string::~string((string *)&imgProcessor);
  if (filepath._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)&imgProcessor,"No input file specified",(allocator *)&img);
    local_78._0_4_ = local_78._0_4_ & 0xffffff00;
    utils::Logger::error((string *)&imgProcessor,(bool *)local_78);
    std::__cxx11::string::~string((string *)&imgProcessor);
  }
  imgProcessor._80_8_ = 0;
  imgProcessor._88_8_ = 0;
  imgProcessor._64_8_ = 0;
  imgProcessor._72_8_ = 0;
  imgProcessor._48_8_ = 0;
  imgProcessor._56_8_ = 0;
  imgProcessor._32_8_ = 0;
  imgProcessor._40_8_ = 0;
  imgProcessor._16_8_ = 0;
  imgProcessor._24_8_ = 0;
  imgProcessor.img = (Mat)0x0;
  imgProcessor._1_7_ = 0;
  imgProcessor._8_8_ = 0;
  cv::Mat::Mat(&imgProcessor.img);
  imgProcessing::ImgProcessor::loadImg((ImgProcessor *)&imgProcessor.img,&filepath);
  imgProcessing::ImgProcessor::process(&letterSegments,&imgProcessor);
  if (bVar1) {
    imgProcessing::ImgProcessor::getBinarizedImg((ImgProcessor *)local_78);
    local_1ab[0] = '\0';
    local_1ab[1] = '\0';
    local_1ab[2] = 0xff;
    list._M_len = 3;
    list._M_array = local_1ab;
    cv::Matx<unsigned_char,_3,_1>::Matx(&local_1b3,list);
    local_1b0 = 3;
    imgProcessing::ImgProcessor::drawSegmentsBBoxes
              ((ImgProcessor *)&img,&imgProcessor.img,
               (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                *)local_78,(Vec3b *)&letterSegments,(uint *)&local_1b3);
    cv::Mat::~Mat((Mat *)local_78);
    local_68.width = 0;
    local_68.height = 0;
    local_78._0_4_ = 0x1010000;
    local_78._8_8_ = (pointer)&img;
    cv::imshow((string *)&filepath,(_InputArray *)local_78);
  }
  else {
    segments = imgProcessing::ImgProcessor::getImg(&imgProcessor);
    local_1b3.val[0] = '\0';
    local_1b3.val[1] = '\0';
    local_1b3.val[2] = '\0';
    list_00._M_len = 3;
    list_00._M_array = local_1b3.val;
    cv::Matx<unsigned_char,_3,_1>::Matx((Matx<unsigned_char,_3,_1> *)&local_1b0,list_00);
    local_78._0_4_ = 3;
    imgProcessing::ImgProcessor::drawSegmentsBBoxes
              ((ImgProcessor *)&img,&imgProcessor.img,
               (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                *)segments,(Vec3b *)&letterSegments,(uint *)&local_1b0);
    local_68.width = 0;
    local_68.height = 0;
    local_78._0_4_ = 0x1010000;
    local_78._8_8_ = (pointer)&img;
    cv::imshow((string *)&filepath,(_InputArray *)local_78);
  }
  cv::Mat::~Mat(&img);
  cv::waitKey(-1);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&letterSegments);
  cv::Mat::~Mat(&imgProcessor.img);
  std::__cxx11::string::~string((string *)&filepath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cmdParser.arguments);
  return;
}

Assistant:

App::App(const std::vector<std::string>& arguments)
{
    try
    {
        auto cmdParser = CmdParser(arguments);

        auto const filepath = cmdParser.getFlagValue("file");
        const bool showBinaryImg = cmdParser.hasFlag("binary");

        if (filepath.length() < 1)
        {
            Logger::error("No input file specified");
        }

        auto imgProcessor = ImgProcessor();

        imgProcessor.loadImg(filepath);

        auto letterSegments = imgProcessor.process();

        if (showBinaryImg) {
            auto img = imgProcessor.drawSegmentsBBoxes(
                imgProcessor.getBinarizedImg(),
                letterSegments,
                { 0, 0, 255 },
                3
            );

            cv::imshow(filepath, img);
        } else {
            auto img = imgProcessor.drawSegmentsBBoxes(
                imgProcessor.getImg(),
                letterSegments,
                { 0, 0, 0 },
                3
            );

            cv::imshow(filepath, img);
        }

        cv::waitKey(-1);

    }
    catch(Logger::Exception &e)
    {
        Logger::error("Terminating...", true);
    }
}